

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *this,
          Animatable<tinyusdz::UsdUVTexture::Wrap> *fallback)

{
  Animatable<tinyusdz::UsdUVTexture::Wrap> *fallback_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>::optional
            (&this->_attrib);
  this->_empty = false;
  Animatable<tinyusdz::UsdUVTexture::Wrap>::Animatable(&this->_fallback,fallback);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}